

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_bitsel_vec_m68k
               (TCGContext_conflict2 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b,TCGv_vec c)

{
  TCGTemp *pTVar1;
  TCGv_vec r_00;
  TCGv_vec t;
  TCGType_conflict type;
  TCGTemp *ct;
  TCGTemp *bt;
  TCGTemp *at;
  TCGTemp *rt;
  TCGv_vec c_local;
  TCGv_vec b_local;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  pTVar1 = tcgv_vec_temp(tcg_ctx,r);
  tcgv_vec_temp(tcg_ctx,a);
  tcgv_vec_temp(tcg_ctx,b);
  tcgv_vec_temp(tcg_ctx,c);
  r_00 = tcg_temp_new_vec_m68k
                   (tcg_ctx,(TCGType_conflict)((ulong)*(undefined8 *)pTVar1 >> 0x10) & 0xff);
  tcg_gen_and_vec_m68k(tcg_ctx,0,r_00,a,b);
  tcg_gen_andc_vec_m68k(tcg_ctx,0,r,c,a);
  tcg_gen_or_vec_m68k(tcg_ctx,0,r,r,r_00);
  tcg_temp_free_vec(tcg_ctx,r_00);
  return;
}

Assistant:

void tcg_gen_bitsel_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a,
                        TCGv_vec b, TCGv_vec c)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *bt = tcgv_vec_temp(tcg_ctx, b);
    TCGTemp *ct = tcgv_vec_temp(tcg_ctx, c);
    TCGType type = rt->base_type;

    tcg_debug_assert(at->base_type >= type);
    tcg_debug_assert(bt->base_type >= type);
    tcg_debug_assert(ct->base_type >= type);

    if (TCG_TARGET_HAS_bitsel_vec) {
        vec_gen_4(tcg_ctx, INDEX_op_bitsel_vec, type, MO_8,
                  temp_arg(rt), temp_arg(at), temp_arg(bt), temp_arg(ct));
    } else {
        TCGv_vec t = tcg_temp_new_vec(tcg_ctx, type);
        tcg_gen_and_vec(tcg_ctx, MO_8, t, a, b);
        tcg_gen_andc_vec(tcg_ctx, MO_8, r, c, a);
        tcg_gen_or_vec(tcg_ctx, MO_8, r, r, t);
        tcg_temp_free_vec(tcg_ctx, t);
    }
}